

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O2

void __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0>::advance
          (ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0> *this,HalfCycles duration
          )

{
  bool bVar1;
  Typer *this_00;
  long lVar2;
  
  (this->time_since_audio_update_).super_WrappedInt<HalfCycles>.length_ =
       (this->time_since_audio_update_).super_WrappedInt<HalfCycles>.length_ +
       (long)duration.super_WrappedInt<HalfCycles>.length_;
  JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>
  ::operator+=(&this->video_,duration);
  bVar1 = (this->video_).did_flush_;
  (this->video_).did_flush_ = false;
  if (bVar1 == true) {
    CPU::Z80::ProcessorBase::set_interrupt_line
              (&(this->z80_).super_ProcessorBase,
               (this->video_).object_.time_into_frame_ - 0x1b1faU < 0x40,
               (HalfCycles)(this->video_).time_overrun_.super_WrappedInt<HalfCycles>.length_);
  }
  if (this->tape_player_is_sleeping_ == false) {
    Storage::Tape::BinaryTapePlayer::run_for
              (&this->tape_player_,(Cycles)duration.super_WrappedInt<HalfCycles>.length_);
  }
  if (((this->use_automatic_tape_motor_control_ == true) &&
      (lVar2 = (this->cycles_since_tape_input_read_).super_WrappedInt<HalfCycles>.length_,
      lVar2 < 3500000)) &&
     (lVar2 = lVar2 + (long)duration.super_WrappedInt<HalfCycles>.length_,
     (this->cycles_since_tape_input_read_).super_WrappedInt<HalfCycles>.length_ = lVar2,
     3499999 < lVar2)) {
    Storage::Tape::BinaryTapePlayer::set_motor_control(&this->tape_player_,false);
    this->recent_tape_hits_ = 0;
  }
  this_00 = (this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>).typer_._M_t.
            super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
            super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
            super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl;
  if (this_00 != (Typer *)0x0) {
    Utility::Typer::run_for(this_00,duration);
    return;
  }
  return;
}

Assistant:

void advance(HalfCycles duration) {
			time_since_audio_update_ += duration;

			video_ += duration;
			if(video_.did_flush()) {
				z80_.set_interrupt_line(video_.last_valid()->get_interrupt_line(), video_.last_sequence_point_overrun());
			}

			if(!tape_player_is_sleeping_) tape_player_.run_for(duration.as_integral());

			// Update automatic tape motor control, if enabled; if it's been
			// 0.5 seconds since software last possibly polled the tape, stop it.
			if(use_automatic_tape_motor_control_ && cycles_since_tape_input_read_ < HalfCycles(clock_rate())) {
				cycles_since_tape_input_read_ += duration;

				if(cycles_since_tape_input_read_ >= HalfCycles(clock_rate())) {
					tape_player_.set_motor_control(false);
					recent_tape_hits_ = 0;
				}
			}

			if constexpr (model == Model::Plus3) {
				fdc_ += Cycles(duration.as_integral());
			}

			if(typer_) typer_->run_for(duration);
		}